

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O2

void __thiscall
my_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~my_context(my_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this)

{
  ~my_context(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

my_context()
        : value_("Steve")
    {
    }